

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall
TPZPrInteg<TPZInt1d>::Point(TPZPrInteg<TPZInt1d> *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long in_RDI;
  unkbyte10 in_ST0;
  longdouble in_ST1;
  int iploc;
  int ipf;
  int iVar4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar5;
  undefined6 uStack_40;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  
  iVar4 = in_ESI;
  iVar1 = TPZGaussRule::NInt(*(TPZGaussRule **)(in_RDI + 0x20));
  iVar1 = in_ESI / iVar1;
  iVar6 = iVar4;
  iVar2 = TPZGaussRule::NInt(*(TPZGaussRule **)(in_RDI + 0x20));
  TPZInt1d::Point((TPZInt1d *)CONCAT44(iVar6,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20)
                  ,in_RCX,(REAL *)CONCAT44(iVar1,iVar4 % iVar2));
  TPZGaussRule::Loc((TPZGaussRule *)CONCAT44(in_stack_ffffffffffffffbc,iVar4),in_ESI);
  uVar5 = (undefined4)in_ST0;
  uStack_40 = (undefined6)((unkuint10)in_ST0 >> 0x20);
  pdVar3 = TPZVec<double>::operator[](in_RDX,1);
  *pdVar3 = (double)(longdouble)CONCAT64(uStack_40,uVar5);
  TPZGaussRule::W((TPZGaussRule *)CONCAT44(uVar5,iVar4),in_ESI);
  in_RCX->_vptr_TPZVec = (_func_int **)(double)((longdouble)(double)in_RCX->_vptr_TPZVec * in_ST1);
  return;
}

Assistant:

void Point(int ip, TPZVec<REAL> &pos, REAL &w) const override
    {
		int ipf = ip/fIntP->NInt();
		int iploc = ip%(fIntP->NInt());
		TFather::Point(ipf,pos,w);
		pos[Dim-1] = fIntP->Loc(iploc);
		w *= fIntP->W(iploc);
    }